

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_stack_check(ASMState *as,BCReg topslot,IRIns *irp,RegSet allow,ExitNo exitno)

{
  uint uVar1;
  uint local_48;
  uint local_44;
  Reg r;
  Reg pbase;
  ExitNo exitno_local;
  RegSet allow_local;
  IRIns *irp_local;
  BCReg topslot_local;
  ASMState *as_local;
  
  if (irp == (IRIns *)0x0) {
    local_44 = 2;
  }
  else {
    local_44 = (uint)(irp->field_1).r;
  }
  if (allow == 0) {
    local_48 = 0;
  }
  else {
    local_48 = 0;
    for (uVar1 = allow; (uVar1 & 1) == 0; uVar1 = uVar1 >> 1 | 0x80000000) {
      local_48 = local_48 + 1;
    }
  }
  emit_jcc(as,2,as->J->exitstubgroup[exitno >> 5] + ((exitno & 0x1f) << 2));
  if (allow == 0) {
    emit_rmro(as,XO_MOV,local_48 | 0x80200,4,0);
  }
  else {
    as->modset = 1 << ((byte)local_48 & 0x1f) | as->modset;
  }
  emit_gri(as,0x838107,local_48 | 0x80200,topslot << 3);
  if (((local_44 & 0x80) == 0) && (local_44 != local_48)) {
    emit_rr(as,0x2b0000fe,local_48 | 0x80200,local_44);
  }
  else {
    emit_rmro(as,0x2b0000fe,local_48 | 0x80200,0xe,((int)as->J + -0x160) - ((int)as->J + 0xca8));
  }
  emit_rmro(as,XO_MOV,local_48 | 0x80200,local_48,0x30);
  emit_rma(as,XO_MOV,local_48 | 0x80200,as->J[-1].penalty + 0x3a);
  if (allow == 0) {
    emit_rmro(as,XO_MOVto,local_48 | 0x80200,4,0);
  }
  return;
}

Assistant:

static void asm_stack_check(ASMState *as, BCReg topslot,
			    IRIns *irp, RegSet allow, ExitNo exitno)
{
  /* Try to get an unused temp. register, otherwise spill/restore eax. */
  Reg pbase = irp ? irp->r : RID_BASE;
  Reg r = allow ? rset_pickbot(allow) : RID_EAX;
  emit_jcc(as, CC_B, exitstub_addr(as->J, exitno));
  if (allow == RSET_EMPTY)  /* Restore temp. register. */
    emit_rmro(as, XO_MOV, r|REX_64, RID_ESP, 0);
  else
    ra_modified(as, r);
  emit_gri(as, XG_ARITHi(XOg_CMP), r|REX_GC64, (int32_t)(8*topslot));
  if (ra_hasreg(pbase) && pbase != r)
    emit_rr(as, XO_ARITH(XOg_SUB), r|REX_GC64, pbase);
  else
#if LJ_GC64
    emit_rmro(as, XO_ARITH(XOg_SUB), r|REX_64, RID_DISPATCH,
	      (int32_t)dispofs(as, &J2G(as->J)->jit_base));
#else
    emit_rmro(as, XO_ARITH(XOg_SUB), r, RID_NONE,
	      ptr2addr(&J2G(as->J)->jit_base));
#endif
  emit_rmro(as, XO_MOV, r|REX_GC64, r, offsetof(lua_State, maxstack));
  emit_getgl(as, r, cur_L);
  if (allow == RSET_EMPTY)  /* Spill temp. register. */
    emit_rmro(as, XO_MOVto, r|REX_64, RID_ESP, 0);
}